

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t len;
  int level_00;
  int iVar4;
  int iVar5;
  char *pcVar6;
  lua_Debug ar;
  lua_Debug local_b0;
  
  iVar1 = lua_gettop(L);
  iVar4 = 1;
  iVar3 = 1;
  do {
    level_00 = iVar3;
    iVar5 = iVar4;
    iVar2 = lua_getstack(L1,level_00,&local_b0);
    iVar4 = level_00;
    iVar3 = level_00 * 2;
  } while (iVar2 != 0);
  if (iVar5 < level_00) {
    do {
      iVar4 = (level_00 + iVar5) / 2;
      iVar3 = lua_getstack(L1,iVar4,&local_b0);
      if (iVar3 != 0) {
        iVar5 = iVar4 + 1;
        iVar4 = level_00;
      }
      level_00 = iVar4;
    } while (iVar5 < level_00);
  }
  iVar4 = 0xc;
  if (level_00 < 0x18) {
    iVar4 = 0;
  }
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n");
  }
  lua_pushlstring(L,"stack traceback:",0x10);
  iVar3 = lua_getstack(L1,level,&local_b0);
  if (iVar3 != 0) {
    do {
      level = level + 1;
      if (level == iVar4) {
        lua_pushlstring(L,"\n\t...",5);
        level = level_00 + -0xb;
      }
      else {
        lua_getinfo(L1,"Slnt",&local_b0);
        lua_pushfstring(L,"\n\t%s:",local_b0.short_src);
        if (0 < local_b0.currentline) {
          lua_pushfstring(L,"%d:");
        }
        lua_pushlstring(L," in ",4);
        if (*local_b0.namewhat == '\0') {
          if (*local_b0.what == 'C') {
            iVar3 = pushglobalfuncname(L,&local_b0);
            if (iVar3 == 0) {
              len = 1;
              pcVar6 = "?";
              goto LAB_00113d2a;
            }
            pcVar6 = lua_tolstring(L,-1,(size_t *)0x0);
            lua_pushfstring(L,"function \'%s\'",pcVar6);
            lua_remove(L,-2);
          }
          else if (*local_b0.what == 'm') {
            len = 10;
            pcVar6 = "main chunk";
LAB_00113d2a:
            lua_pushlstring(L,pcVar6,len);
          }
          else {
            lua_pushfstring(L,"function <%s:%d>",local_b0.short_src,
                            (ulong)(uint)local_b0.linedefined);
          }
        }
        else {
          lua_pushfstring(L,"function \'%s\'",local_b0.name);
        }
        if (local_b0.istailcall != '\0') {
          lua_pushlstring(L,"\n\t(...tail calls...)",0x14);
        }
        iVar3 = lua_gettop(L);
        lua_concat(L,iVar3 - iVar1);
      }
      iVar3 = lua_getstack(L1,level,&local_b0);
    } while (iVar3 != 0);
  }
  iVar4 = lua_gettop(L);
  lua_concat(L,iVar4 - iVar1);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  lua_Debug ar;
  int top = lua_gettop(L);
  int numlevels = countlevels(L1);
  int mark = (numlevels > LEVELS1 + LEVELS2) ? LEVELS1 : 0;
  if (msg) lua_pushfstring(L, "%s\n", msg);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (level == mark) {  /* too many levels? */
      lua_pushliteral(L, "\n\t...");  /* add a '...' */
      level = numlevels - LEVELS2;  /* and skip to last ones */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
      if (ar.currentline > 0)
        lua_pushfstring(L, "%d:", ar.currentline);
      lua_pushliteral(L, " in ");
      pushfuncname(L, &ar);
      if (ar.istailcall)
        lua_pushliteral(L, "\n\t(...tail calls...)");
      lua_concat(L, lua_gettop(L) - top);
    }
  }
  lua_concat(L, lua_gettop(L) - top);
}